

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  cmValue cVar10;
  string *psVar11;
  cmGlobalNinjaGenerator *this_00;
  _Alloc_hider _Var12;
  string_view source;
  string_view str;
  string_view source_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string linkCmdStr;
  string cmakeCommand_1;
  string linkCmdVar;
  string targetOutputReal;
  string ruleVar;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmGeneratorTarget::GetLinkerLanguage(&cmakeCommand_1,pcVar4,config);
  cmGeneratorTarget::GetCreateRuleVariable(&linkCmdVar,pcVar4,&cmakeCommand_1,config);
  paVar1 = &cmakeCommand_1.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeCommand_1._M_dataplus._M_p != paVar1) {
    operator_delete(cmakeCommand_1._M_dataplus._M_p,cmakeCommand_1.field_2._M_allocated_capacity + 1
                   );
  }
  cVar10 = cmMakefile::GetDefinition(pcVar3,&linkCmdVar);
  if (cVar10.Value == (string *)0x0) {
    paVar2 = &linkCmdVar.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdVar._M_dataplus._M_p != paVar2) {
      operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
    }
    TVar8 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar8 - SHARED_LIBRARY < 2) {
      return __return_storage_ptr__;
    }
    if (TVar8 == EXECUTABLE) {
      cmGeneratorTarget::GetLinkerLanguage
                (&cmakeCommand_1,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      iVar9 = std::__cxx11::string::compare((char *)&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != paVar1) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if (iVar9 != 0) {
        return __return_storage_ptr__;
      }
      bVar7 = cmGeneratorTarget::IsExecutableWithExports
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
      if (!bVar7) {
        return __return_storage_ptr__;
      }
      pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      cmakeCommand_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cmakeCommand_1,"CMAKE_EXE_EXPORTS_Swift_FLAG","");
      cmMakefile::GetDefExpandList(pcVar3,&cmakeCommand_1,__return_storage_ptr__,false);
      linkCmdVar.field_2._M_allocated_capacity = cmakeCommand_1.field_2._M_allocated_capacity;
      _Var12 = cmakeCommand_1._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
    }
    else {
      if (TVar8 != STATIC_LIBRARY) {
        __assert_fail("false && \"Unexpected target type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                      ,0x291,
                      "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(const std::string &)"
                     );
      }
      pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source_00._M_str = (psVar11->_M_dataplus)._M_p;
      source_00._M_len = psVar11->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&cmakeCommand_1,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source_00,SHELL);
      linkCmdVar._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&linkCmdVar,cmakeCommand_1._M_dataplus._M_p,
                 cmakeCommand_1._M_dataplus._M_p + cmakeCommand_1._M_string_length);
      std::__cxx11::string::append((char *)&linkCmdVar);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&linkCmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p != paVar2) {
        operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetLinkerLanguage
                (&linkCmdStr,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = linkCmdStr._M_string_length;
      cmakeCommand_1.field_2._8_8_ = linkCmdStr._M_dataplus._M_p;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&cmakeCommand_1;
      cmCatViews_abi_cxx11_(&linkCmdVar,views_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      cmGeneratorTarget::GetLinkerLanguage(&linkCmdStr,pcVar4,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&cmakeCommand_1,pcVar4,&linkCmdVar,&linkCmdStr,config);
      std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      psVar11 = cmMakefile::GetRequiredDefinition(pcVar3,&linkCmdVar);
      arg_00._M_str = (psVar11->_M_dataplus)._M_p;
      arg_00._M_len = psVar11->_M_string_length;
      cmExpandList(arg_00,__return_storage_ptr__,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p != paVar2) {
        operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetLinkerLanguage
                (&linkCmdStr,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = linkCmdStr._M_string_length;
      cmakeCommand_1.field_2._8_8_ = linkCmdStr._M_dataplus._M_p;
      views_03._M_len = 3;
      views_03._M_array = (iterator)&cmakeCommand_1;
      cmCatViews_abi_cxx11_(&linkCmdVar,views_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      cmGeneratorTarget::GetLinkerLanguage(&linkCmdStr,pcVar4,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&cmakeCommand_1,pcVar4,&linkCmdVar,&linkCmdStr,config);
      std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      psVar11 = cmMakefile::GetRequiredDefinition(pcVar3,&linkCmdVar);
      arg_01._M_str = (psVar11->_M_dataplus)._M_p;
      arg_01._M_len = psVar11->_M_string_length;
      cmExpandList(arg_01,__return_storage_ptr__,false);
      _Var12 = linkCmdVar._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p == paVar2) {
        return __return_storage_ptr__;
      }
    }
  }
  else {
    linkCmdStr._M_dataplus._M_p = (pointer)&linkCmdStr.field_2;
    pcVar5 = ((cVar10.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&linkCmdStr,pcVar5,pcVar5 + (cVar10.Value)->_M_string_length);
    bVar7 = cmGeneratorTarget::HasImplibGNUtoMS
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,config);
    if (bVar7) {
      cmGeneratorTarget::GetLinkerLanguage
                (&targetOutputReal,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = targetOutputReal._M_string_length;
      cmakeCommand_1.field_2._8_8_ = targetOutputReal._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&cmakeCommand_1;
      cmCatViews_abi_cxx11_(&ruleVar,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
        operator_delete(targetOutputReal._M_dataplus._M_p,
                        targetOutputReal.field_2._M_allocated_capacity + 1);
      }
      cVar10 = cmMakefile::GetDefinition
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,&ruleVar);
      if (cVar10.Value != (string *)0x0) {
        std::__cxx11::string::_M_append
                  ((char *)&linkCmdStr,(ulong)((cVar10.Value)->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ruleVar._M_dataplus._M_p != &ruleVar.field_2) {
        operator_delete(ruleVar._M_dataplus._M_p,ruleVar.field_2._M_allocated_capacity + 1);
      }
    }
    arg._M_str = linkCmdStr._M_dataplus._M_p;
    arg._M_len = linkCmdStr._M_string_length;
    cmExpandList(arg,__return_storage_ptr__,false);
    if ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.UseLWYU == true) {
      cmakeCommand_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cmakeCommand_1,"CMAKE_LINK_WHAT_YOU_USE_CHECK","");
      cVar10 = cmMakefile::GetDefinition(pcVar3,&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != paVar1) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if (cVar10.Value != (string *)0x0) {
        pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        source._M_str = (psVar11->_M_dataplus)._M_p;
        source._M_len = psVar11->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&targetOutputReal,
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,source,SHELL);
        cmakeCommand_1._M_dataplus._M_p = (pointer)targetOutputReal._M_string_length;
        cmakeCommand_1._M_string_length = (size_type)targetOutputReal._M_dataplus._M_p;
        cmakeCommand_1.field_2._M_allocated_capacity = 0x1c;
        cmakeCommand_1.field_2._8_8_ = anon_var_dwarf_103bd6c;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&cmakeCommand_1;
        cmCatViews_abi_cxx11_(&ruleVar,views_00);
        paVar2 = &targetOutputReal.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetOutputReal._M_dataplus._M_p != paVar2) {
          operator_delete(targetOutputReal._M_dataplus._M_p,
                          targetOutputReal.field_2._M_allocated_capacity + 1);
        }
        str._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
        str._M_len = (cVar10.Value)->_M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&cmakeCommand_1,
                   &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->
                    super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,str
                   ,false,false,false,false,false);
        std::__cxx11::string::_M_append((char *)&ruleVar,(ulong)cmakeCommand_1._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakeCommand_1._M_dataplus._M_p != paVar1) {
          operator_delete(cmakeCommand_1._M_dataplus._M_p,
                          cmakeCommand_1.field_2._M_allocated_capacity + 1);
        }
        cmGeneratorTarget::GetFullPath
                  (&cmakeCommand_1,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget,config,RuntimeBinaryArtifact,true);
        this_00 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar11 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this_00,&cmakeCommand_1);
        pcVar5 = (psVar11->_M_dataplus)._M_p;
        targetOutputReal._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetOutputReal,pcVar5,pcVar5 + psVar11->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakeCommand_1._M_dataplus._M_p != paVar1) {
          operator_delete(cmakeCommand_1._M_dataplus._M_p,
                          cmakeCommand_1.field_2._M_allocated_capacity + 1);
        }
        cmakeCommand_1._M_dataplus._M_p = (pointer)0xa;
        cmakeCommand_1._M_string_length = (size_type)anon_var_dwarf_103bd86;
        cmakeCommand_1.field_2._M_allocated_capacity = targetOutputReal._M_string_length;
        cmakeCommand_1.field_2._8_8_ = targetOutputReal._M_dataplus._M_p;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&cmakeCommand_1;
        cmCatViews_abi_cxx11_(&local_50,views_01);
        std::__cxx11::string::_M_append((char *)&ruleVar,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&ruleVar);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetOutputReal._M_dataplus._M_p != paVar2) {
          operator_delete(targetOutputReal._M_dataplus._M_p,
                          targetOutputReal.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ruleVar._M_dataplus._M_p != &ruleVar.field_2) {
          operator_delete(ruleVar._M_dataplus._M_p,ruleVar.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
      operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = linkCmdVar._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdVar._M_dataplus._M_p == &linkCmdVar.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var12._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(
  const std::string& config)
{
  std::vector<std::string> linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage(config), config);
    cmValue linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = *linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(config)) {
        std::string ruleVar =
          cmStrCat("CMAKE_", this->GeneratorTarget->GetLinkerLanguage(config),
                   "_GNUtoMS_RULE");
        if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += *rule;
        }
      }
      cmExpandList(linkCmdStr, linkCmds);
      if (this->UseLWYU) {
        cmValue lwyuCheck = mf->GetDefinition("CMAKE_LINK_WHAT_YOU_USE_CHECK");
        if (lwyuCheck) {
          std::string cmakeCommand = cmStrCat(
            this->GetLocalGenerator()->ConvertToOutputFormat(
              cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL),
            " -E __run_co_compile --lwyu=");
          cmakeCommand +=
            this->GetLocalGenerator()->EscapeForShell(*lwyuCheck);

          std::string targetOutputReal =
            this->ConvertToNinjaPath(this->GetGeneratorTarget()->GetFullPath(
              config, cmStateEnums::RuntimeBinaryArtifact,
              /*realname=*/true));
          cmakeCommand += cmStrCat(" --source=", targetOutputReal);
          linkCmds.push_back(std::move(cmakeCommand));
        }
      }
      return linkCmds;
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E rm -f $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_CREATE");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_FINISH");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;
    case cmStateEnums::EXECUTABLE:
      if (this->TargetLinkLanguage(config) == "Swift") {
        if (this->GeneratorTarget->IsExecutableWithExports()) {
          this->Makefile->GetDefExpandList("CMAKE_EXE_EXPORTS_Swift_FLAG",
                                           linkCmds);
        }
      }
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return linkCmds;
}